

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O1

int lws_client_socket_service(lws *wsi,pollfd *pollfd)

{
  char cVar1;
  ushort uVar2;
  lws_context *plVar3;
  uchar *buf;
  allocated_headers *paVar4;
  uint uVar5;
  lws_parser_return_t lVar6;
  int iVar7;
  int iVar8;
  lws *plVar9;
  long lVar10;
  ssize_t sVar11;
  int *piVar12;
  char *pcVar13;
  size_t len;
  int used;
  long lVar14;
  int n;
  char ebuf [128];
  lws *in_stack_ffffffffffffff38;
  uint local_bc;
  lws_tokens local_b8 [8];
  
  plVar3 = wsi->context;
  cVar1 = wsi->tsi;
  buf = plVar3->pt[cVar1].serv_buf;
  uVar2 = (ushort)wsi->wsistate;
  uVar5 = (uint)uVar2;
  if (0x200 < uVar2) {
    if (10 < uVar5 - 0x201) {
      return 0;
    }
    switch(uVar5) {
    case 0x201:
      _lws_log(1,"%s: wsi %p: WAITING_DNS\n","lws_client_socket_service",wsi);
      plVar9 = lws_client_connect_2_dnsreq(wsi);
      if (plVar9 == (lws *)0x0) {
        _lws_log(0x100,"closed\n");
        return -1;
      }
      return 0;
    case 0x202:
      if ((pollfd->revents & 4) != 0) {
        lws_client_connect_3_connect(wsi,(char *)0x0,(addrinfo *)0x0,0,(void *)0x0);
        return 0;
      }
      return 0;
    case 0x203:
      goto switchD_001243a2_caseD_203;
    case 0x204:
      goto switchD_001243a2_caseD_204;
    default:
      goto LAB_00124a89;
    case 0x20b:
      if ((pollfd->revents & 0x19U) == 0x18) {
        _lws_log(0x10,"Server connection %p (fd=%d) dead\n",wsi,(ulong)(uint)pollfd->fd);
        pcVar13 = "Peer hung up";
      }
      else {
        iVar8 = 0;
        if ((pollfd->revents & 1U) == 0) {
          return 0;
        }
        pcVar13 = (char *)0x0;
        do {
          if (((wsi->http).ah)->parser_state == 'd') goto LAB_00124686;
          local_b8[0].token = (uchar *)0x0;
          local_b8[0].len = 0;
          uVar5 = lws_buflist_aware_read
                            (plVar3->pt + cVar1,wsi,local_b8,'\0',"lws_client_socket_service");
          _lws_log(0x10,"%s: buflist-aware-read %d %d\n","lws_client_socket_service",(ulong)uVar5,
                   (ulong)(uint)local_b8[0].len);
          if (local_b8[0].len == 0xfffffffc) {
LAB_0012451a:
            iVar7 = 1;
            iVar8 = 0;
          }
          else {
            iVar7 = 3;
            if ((int)(local_b8[0].len | uVar5) < 0) {
              pcVar13 = "read failed";
            }
            else {
              if (local_b8[0].len == 0) goto LAB_0012451a;
              local_bc = local_b8[0].len;
              lVar6 = lws_parse(wsi,local_b8[0].token,(int *)&local_bc);
              if (lVar6 == LPR_OK) {
                lVar14 = (long)local_b8[0].len;
                lVar10 = (long)(int)local_bc;
                used = (int)(lVar14 - lVar10);
                iVar7 = lws_buflist_aware_finished_consuming
                                  (wsi,local_b8,used,uVar5,"lws_client_socket_service");
                if (iVar7 == 0) {
                  local_b8[0].token = local_b8[0].token + (lVar14 - lVar10);
                  local_b8[0].len = local_b8[0].len - used;
                  if (local_bc == 0) {
                    iVar7 = 0;
                  }
                  else {
                    iVar7 = 7;
                    if (((wsi->http).ah)->parser_state != 'd') {
                      __assert_fail("wsi->http.ah->parser_state == WSI_PARSING_COMPLETE",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/client/client-http.c"
                                    ,400,
                                    "int lws_client_socket_service(struct lws *, struct pollfd *)");
                    }
                  }
                }
                else {
                  iVar7 = 1;
                  iVar8 = -1;
                }
              }
              else {
                _lws_log(2,"problems parsing header\n");
                pcVar13 = "problems parsing header";
              }
            }
          }
        } while (iVar7 == 0);
        if (iVar7 != 3) {
          if (iVar7 != 7) {
            return iVar8;
          }
LAB_00124686:
          if (((wsi->http).ah)->parser_state != 'd') {
            return 0;
          }
          iVar8 = lws_client_interpret_server_handshake(in_stack_ffffffffffffff38);
          return iVar8;
        }
      }
      goto LAB_00124a2e;
    }
  }
  if (uVar5 == 0x12) goto LAB_001246f6;
  if (uVar5 == 0x13) goto LAB_00124791;
  if (uVar5 != 0x14) {
    return 0;
  }
  if ((wsi->field_0x2e2 & 1) != 0) {
    return 0;
  }
  goto LAB_0012491e;
switchD_001243a2_caseD_203:
  if ((pollfd->revents & 0x18) != 0) {
    _lws_log(2,"Proxy connection %p (fd=%d) dead\n",wsi,(ulong)(uint)pollfd->fd);
    pcVar13 = "proxy conn dead";
    goto LAB_00124a2e;
  }
  sVar11 = recv((wsi->desc).sockfd,buf,(ulong)plVar3->pt_serv_buf_size,0);
  if ((int)sVar11 < 0) {
    piVar12 = __errno_location();
    if (*piVar12 == 0xb) {
      _lws_log(0x10,"Proxy read EAGAIN... retrying\n");
      return 0;
    }
    _lws_log(1,"ERROR reading from proxy socket\n");
    pcVar13 = "proxy read err";
    goto LAB_00124a2e;
  }
  plVar3->pt[cVar1].serv_buf[0xd] = '\0';
  if (((int)sVar11 < 0xd) ||
     ((iVar8 = strncmp((char *)buf,"HTTP/1.0 200 ",0xd), iVar8 != 0 &&
      (iVar8 = strncmp((char *)buf,"HTTP/1.1 200 ",0xd), iVar8 != 0)))) {
    _lws_log(1,"%s: ERROR proxy did not reply with h1\n","lws_client_socket_service");
    pcVar13 = "proxy not h1";
    goto LAB_00124a2e;
  }
  _lws_log(8,"%s: proxy connection extablished\n","lws_client_socket_service");
  lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
LAB_001246f6:
  iVar8 = lws_change_pollfd(wsi,4,0);
  if (iVar8 != 0) {
    return -1;
  }
  if (((wsi->tls).use_ssl & 1) == 0) {
    (wsi->tls).ssl = (lws_tls_conn *)0x0;
  }
  else {
    if (((wsi->field_0x2e2 & 2) == 0) && (iVar8 = lws_tls_restrict_borrow(wsi->context), iVar8 != 0)
       ) {
      pcVar13 = "tls restriction limit";
      goto LAB_00124a2e;
    }
    if (((wsi->tls).ssl == (lws_tls_conn *)0x0) &&
       (iVar8 = lws_ssl_client_bio_create(wsi), iVar8 < 0)) {
      pcVar13 = "bio_create failed";
      goto LAB_00124a2e;
    }
    iVar8 = lws_ssl_client_connect1(wsi);
    if (iVar8 == 0) {
      return 0;
    }
    if (iVar8 < 0) {
      pcVar13 = "lws_ssl_client_connect1 failed";
      goto LAB_00124a2e;
    }
  }
switchD_001243a2_caseD_204:
  if (((wsi->tls).use_ssl & 1) == 0) {
    (wsi->tls).ssl = (lws_tls_conn *)0x0;
  }
  else {
    pcVar13 = (char *)local_b8;
    iVar8 = lws_ssl_client_connect2(wsi,pcVar13,0x80);
    if (iVar8 == 0) {
      return 0;
    }
    if (iVar8 < 0) goto LAB_00124a2e;
  }
  if ((wsi->field_0x2e2 & 0x40) != 0) {
    lws_tls_server_conn_alpn(wsi);
    iVar8 = lws_h2_issue_preface(wsi);
    if (iVar8 == 0) {
      return 0;
    }
    pcVar13 = "error sending h2 preface";
LAB_00124a2e:
    _lws_log(8,"closing conn at LWS_CONNMODE...SERVER_REPLY\n");
    if ((lws_tokens *)pcVar13 != (lws_tokens *)0x0) {
      _lws_log(8,"reason: %s\n",pcVar13);
    }
    len = strlen(pcVar13);
    lws_inform_client_conn_fail(wsi,pcVar13,len);
    lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"cbail3");
    return -1;
  }
  lwsi_set_state(wsi,0x13);
  lws_set_timeout(wsi,PENDING_TIMEOUT_AWAITING_CLIENT_HS_SEND,plVar3->timeout_secs);
LAB_00124791:
  pcVar13 = lws_generate_client_handshake(wsi,(char *)buf);
  if (pcVar13 == (char *)0x0) {
    if (wsi->role_ops == &role_ops_raw_file || wsi->role_ops == &role_ops_raw_skt) {
      return 0;
    }
    _lws_log(1,"Failed to generate handshake for client\n");
    pcVar13 = "chs";
LAB_00124857:
    lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,pcVar13);
    return 0;
  }
  _lws_log(8,"%s: HANDSHAKE2: %p: sending headers (wsistate 0x%lx), w sock %d\n",
           "lws_client_socket_service",wsi,(ulong)wsi->wsistate,(ulong)(uint)(wsi->desc).sockfd);
  iVar8 = lws_ssl_capable_write(wsi,buf,(int)pcVar13 - (int)buf);
  if (iVar8 == -4) {
    lws_callback_on_writable(wsi);
  }
  else if (iVar8 == -1) {
    _lws_log(0x10,"ERROR writing to client socket\n");
    pcVar13 = "cws";
    goto LAB_00124857;
  }
  if ((wsi->field_0x2e2 & 1) != 0) {
    _lws_log(0x10,"body pending\n");
    lwsi_set_state(wsi,0x14);
    lws_set_timeout(wsi,PENDING_TIMEOUT_CLIENT_ISSUE_PAYLOAD,plVar3->timeout_secs);
    if ((wsi->flags & 0x800) != 0) {
      lws_callback_on_writable(wsi);
      return 0;
    }
    return 0;
  }
  lwsi_set_state(wsi,0x20b);
  wsi->field_0x2dc = wsi->field_0x2dc & 0xfe;
  if ((short)wsi->wsistate == 0x11) {
    lwsi_set_state(wsi,0x20b);
    wsi->field_0x2dc = wsi->field_0x2dc & 0xfe;
    paVar4 = (wsi->http).ah;
    paVar4->parser_state = '`';
    paVar4->lextable_pos = 0;
    paVar4->unk_pos = 0;
    paVar4->ues = '\0';
  }
  lws_set_timeout(wsi,PENDING_TIMEOUT_AWAITING_SERVER_RESPONSE,wsi->context->timeout_secs);
  lws_callback_on_writable(wsi);
LAB_0012491e:
  paVar4 = (wsi->http).ah;
  paVar4->parser_state = '`';
  paVar4->lextable_pos = 0;
  paVar4->unk_pos = 0;
  lwsi_set_state(wsi,0x20b);
  lws_set_timeout(wsi,PENDING_TIMEOUT_AWAITING_SERVER_RESPONSE,plVar3->timeout_secs);
LAB_00124a89:
  return 0;
}

Assistant:

int
lws_client_socket_service(struct lws *wsi, struct lws_pollfd *pollfd)
{
	struct lws_context *context = wsi->context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	char *p = (char *)&pt->serv_buf[0];
#if defined(LWS_WITH_TLS)
	char ebuf[128];
#endif
	const char *cce = NULL;
	char *sb = p;
	int n = 0;

	switch (lwsi_state(wsi)) {

	case LRS_WAITING_DNS:
		/*
		 * we are under PENDING_TIMEOUT_SENT_CLIENT_HANDSHAKE
		 * timeout protection set in client-handshake.c
		 */
		lwsl_err("%s: wsi %p: WAITING_DNS\n", __func__, wsi);
		if (!lws_client_connect_2_dnsreq(wsi)) {
			/* closed */
			lwsl_client("closed\n");
			return -1;
		}

		/* either still pending connection, or changed mode */
		return 0;

	case LRS_WAITING_CONNECT:

		/*
		 * we are under PENDING_TIMEOUT_SENT_CLIENT_HANDSHAKE
		 * timeout protection set in client-handshake.c
		 */
		if (pollfd->revents & LWS_POLLOUT)
			lws_client_connect_3_connect(wsi, NULL, NULL, 0, NULL);
		break;

#if defined(LWS_WITH_SOCKS5)
	/* SOCKS Greeting Reply */
	case LRS_WAITING_SOCKS_GREETING_REPLY:
	case LRS_WAITING_SOCKS_AUTH_REPLY:
	case LRS_WAITING_SOCKS_CONNECT_REPLY:

		switch (lws_socks5c_handle_state(wsi, pollfd, &cce)) {
		case LW5CHS_RET_RET0:
			return 0;
		case LW5CHS_RET_BAIL3:
			goto bail3;
		case LW5CHS_RET_STARTHS:
			goto start_ws_handshake;
		default:
			break;
		}
		break;
#endif

	case LRS_WAITING_PROXY_REPLY:

		/* handle proxy hung up on us */

		if (pollfd->revents & LWS_POLLHUP) {

			lwsl_warn("Proxy connection %p (fd=%d) dead\n",
				  (void *)wsi, pollfd->fd);

			cce = "proxy conn dead";
			goto bail3;
		}

		n = recv(wsi->desc.sockfd, sb, context->pt_serv_buf_size, 0);
		if (n < 0) {
			if (LWS_ERRNO == LWS_EAGAIN) {
				lwsl_debug("Proxy read EAGAIN... retrying\n");
				return 0;
			}
			lwsl_err("ERROR reading from proxy socket\n");
			cce = "proxy read err";
			goto bail3;
		}

		pt->serv_buf[13] = '\0';
		if (n < 13 || (strncmp(sb, "HTTP/1.0 200 ", 13) &&
		    strncmp(sb, "HTTP/1.1 200 ", 13))) {
			lwsl_err("%s: ERROR proxy did not reply with h1\n",
					__func__);
			/* lwsl_hexdump_notice(sb, n); */
			cce = "proxy not h1";
			goto bail3;
		}

		lwsl_info("%s: proxy connection extablished\n", __func__);

		/* clear his proxy connection timeout */

		lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

		/* fallthru */

	case LRS_H1C_ISSUE_HANDSHAKE:

		/*
		 * we are under PENDING_TIMEOUT_SENT_CLIENT_HANDSHAKE
		 * timeout protection set in client-handshake.c
		 *
		 * take care of our lws_callback_on_writable
		 * happening at a time when there's no real connection yet
		 */
#if defined(LWS_WITH_SOCKS5)
start_ws_handshake:
#endif
		if (lws_change_pollfd(wsi, LWS_POLLOUT, 0))
			return -1;

#if defined(LWS_WITH_TLS)
		/* we can retry this... just cook the SSL BIO the first time */

		if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {

			if (!wsi->transaction_from_pipeline_queue &&
			    lws_tls_restrict_borrow(wsi->context)) {
				cce = "tls restriction limit";
				goto bail3;
			}

			if (!wsi->tls.ssl && lws_ssl_client_bio_create(wsi) < 0) {
				cce = "bio_create failed";
				goto bail3;
			}

			n = lws_ssl_client_connect1(wsi);
			if (!n)
				return 0;
			if (n < 0) {
				cce = "lws_ssl_client_connect1 failed";
				goto bail3;
			}
		} else
			wsi->tls.ssl = NULL;

		/* fallthru */

	case LRS_WAITING_SSL:

		if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {
			n = lws_ssl_client_connect2(wsi, ebuf, sizeof(ebuf));
			if (!n)
				return 0;
			if (n < 0) {
				cce = ebuf;
				goto bail3;
			}
		} else
			wsi->tls.ssl = NULL;
#endif
#if defined(LWS_WITH_DETAILED_LATENCY)
		if (context->detailed_latency_cb) {
			wsi->detlat.type = LDLT_TLS_NEG_CLIENT;
			wsi->detlat.latencies[LAT_DUR_PROXY_CLIENT_REQ_TO_WRITE] =
				lws_now_usecs() -
				wsi->detlat.earliest_write_req_pre_write;
			wsi->detlat.latencies[LAT_DUR_USERCB] = 0;
			lws_det_lat_cb(wsi->context, &wsi->detlat);
		}
#endif
#if defined (LWS_WITH_HTTP2)
		if (wsi->client_h2_alpn) {
			/*
			 * We connected to the server and set up tls, and
			 * negotiated "h2".
			 *
			 * So this is it, we are an h2 master client connection
			 * now, not an h1 client connection.
			 */
#if defined(LWS_WITH_TLS)
			lws_tls_server_conn_alpn(wsi);
#endif

			/* send the H2 preface to legitimize the connection */
			if (lws_h2_issue_preface(wsi)) {
				cce = "error sending h2 preface";
				goto bail3;
			}

			break;
		}
#endif
		lwsi_set_state(wsi, LRS_H1C_ISSUE_HANDSHAKE2);
		lws_set_timeout(wsi, PENDING_TIMEOUT_AWAITING_CLIENT_HS_SEND,
				context->timeout_secs);

		/* fallthru */

	case LRS_H1C_ISSUE_HANDSHAKE2:
		p = lws_generate_client_handshake(wsi, p);
		if (p == NULL) {
			if (wsi->role_ops == &role_ops_raw_skt ||
			    wsi->role_ops == &role_ops_raw_file)
				return 0;

			lwsl_err("Failed to generate handshake for client\n");
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "chs");
			return 0;
		}

		/* send our request to the server */

		lwsl_info("%s: HANDSHAKE2: %p: sending headers "
			  "(wsistate 0x%lx), w sock %d\n",
			  __func__, wsi, (unsigned long)wsi->wsistate,
			  wsi->desc.sockfd);
#if defined(LWS_WITH_DETAILED_LATENCY)
		wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif
		n = lws_ssl_capable_write(wsi, (unsigned char *)sb, (int)(p - sb));
		switch (n) {
		case LWS_SSL_CAPABLE_ERROR:
			lwsl_debug("ERROR writing to client socket\n");
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "cws");
			return 0;
		case LWS_SSL_CAPABLE_MORE_SERVICE:
			lws_callback_on_writable(wsi);
			break;
		}

		if (wsi->client_http_body_pending) {
			lwsl_debug("body pending\n");
			lwsi_set_state(wsi, LRS_ISSUE_HTTP_BODY);
			lws_set_timeout(wsi,
					PENDING_TIMEOUT_CLIENT_ISSUE_PAYLOAD,
					context->timeout_secs);

			if (wsi->flags & LCCSCF_HTTP_X_WWW_FORM_URLENCODED)
				lws_callback_on_writable(wsi);
#if defined(LWS_WITH_HTTP_PROXY)
			if (wsi->http.proxy_clientside)
				lws_callback_on_writable(wsi);
#endif
			/* user code must ask for writable callback */
			break;
		}

		lwsi_set_state(wsi, LRS_WAITING_SERVER_REPLY);
		wsi->hdr_parsing_completed = 0;

		if (lwsi_state(wsi) == LRS_IDLING) {
			lwsi_set_state(wsi, LRS_WAITING_SERVER_REPLY);
			wsi->hdr_parsing_completed = 0;
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
			wsi->http.ah->parser_state = WSI_TOKEN_NAME_PART;
			wsi->http.ah->lextable_pos = 0;
#if defined(LWS_WITH_CUSTOM_HEADERS)
			wsi->http.ah->unk_pos = 0;
#endif
			/* If we're (re)starting on hdr, need other implied init */
			wsi->http.ah->ues = URIES_IDLE;
#endif
		}

		lws_set_timeout(wsi, PENDING_TIMEOUT_AWAITING_SERVER_RESPONSE,
				wsi->context->timeout_secs);

		lws_callback_on_writable(wsi);

		goto client_http_body_sent;

	case LRS_ISSUE_HTTP_BODY:
#if defined(LWS_WITH_HTTP_PROXY)
			if (wsi->http.proxy_clientside) {
				lws_callback_on_writable(wsi);
				break;
			}
#endif
		if (wsi->client_http_body_pending) {
			//lws_set_timeout(wsi,
			//		PENDING_TIMEOUT_CLIENT_ISSUE_PAYLOAD,
			//		context->timeout_secs);
			/* user code must ask for writable callback */
			break;
		}
client_http_body_sent:
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		/* prepare ourselves to do the parsing */
		wsi->http.ah->parser_state = WSI_TOKEN_NAME_PART;
		wsi->http.ah->lextable_pos = 0;
#if defined(LWS_WITH_CUSTOM_HEADERS)
		wsi->http.ah->unk_pos = 0;
#endif
#endif
		lwsi_set_state(wsi, LRS_WAITING_SERVER_REPLY);
		lws_set_timeout(wsi, PENDING_TIMEOUT_AWAITING_SERVER_RESPONSE,
				context->timeout_secs);
		break;

	case LRS_WAITING_SERVER_REPLY:
		/*
		 * handle server hanging up on us...
		 * but if there is POLLIN waiting, handle that first
		 */
		if ((pollfd->revents & (LWS_POLLIN | LWS_POLLHUP)) ==
								LWS_POLLHUP) {

			lwsl_debug("Server connection %p (fd=%d) dead\n",
				(void *)wsi, pollfd->fd);
			cce = "Peer hung up";
			goto bail3;
		}

		if (!(pollfd->revents & LWS_POLLIN))
			break;

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		/* interpret the server response
		 *
		 *  HTTP/1.1 101 Switching Protocols
		 *  Upgrade: websocket
		 *  Connection: Upgrade
		 *  Sec-WebSocket-Accept: me89jWimTRKTWwrS3aRrL53YZSo=
		 *  Sec-WebSocket-Nonce: AQIDBAUGBwgJCgsMDQ4PEC==
		 *  Sec-WebSocket-Protocol: chat
		 *
		 * we have to take some care here to only take from the
		 * socket bytewise.  The browser may (and has been seen to
		 * in the case that onopen() performs websocket traffic)
		 * coalesce both handshake response and websocket traffic
		 * in one packet, since at that point the connection is
		 * definitively ready from browser pov.
		 */
		while (wsi->http.ah->parser_state != WSI_PARSING_COMPLETE) {
			struct lws_tokens eb;
			int n, m, buffered;

			eb.token = NULL;
			eb.len = 0;
			buffered = lws_buflist_aware_read(pt, wsi, &eb, 0, __func__);
			lwsl_debug("%s: buflist-aware-read %d %d\n", __func__,
					buffered, eb.len);
			if (eb.len == LWS_SSL_CAPABLE_MORE_SERVICE)
				return 0;
			if (buffered < 0 || eb.len < 0) {
				cce = "read failed";
				goto bail3;
			}
			if (!eb.len)
				return 0;

			n = eb.len;
			if (lws_parse(wsi, eb.token, &n)) {
				lwsl_warn("problems parsing header\n");
				cce = "problems parsing header";
				goto bail3;
			}

			m = eb.len - n;
			if (lws_buflist_aware_finished_consuming(wsi, &eb, m,
								 buffered,
								 __func__))
			        return -1;
			eb.token += m;
			eb.len -= m;

			if (n) {
				assert(wsi->http.ah->parser_state ==
						WSI_PARSING_COMPLETE);

				break;
			}
		}

		/*
		 * hs may also be coming in multiple packets, there is a 5-sec
		 * libwebsocket timeout still active here too, so if parsing did
		 * not complete just wait for next packet coming in this state
		 */
		if (wsi->http.ah->parser_state != WSI_PARSING_COMPLETE)
			break;
#endif

		/*
		 * otherwise deal with the handshake.  If there's any
		 * packet traffic already arrived we'll trigger poll() again
		 * right away and deal with it that way
		 */
		return lws_client_interpret_server_handshake(wsi);

bail3:
		lwsl_info("closing conn at LWS_CONNMODE...SERVER_REPLY\n");
		if (cce)
			lwsl_info("reason: %s\n", cce);
		lws_inform_client_conn_fail(wsi, (void *)cce, strlen(cce));

		lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "cbail3");
		return -1;

	default:
		break;
	}

	return 0;
}